

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

void __thiscall
t_lua_generator::generate_deserialize_field
          (t_lua_generator *this,ostream *out,t_field *tfield,bool local,string *prefix)

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  ostream *poVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  char *pcVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  t_base_type *this_00;
  undefined1 auVar9 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_b0,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar4,&local_b0,&tfield->name_);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&local_b0,prefix,&tfield->name_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar2 == '\0') &&
         (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         (char)iVar2 == '\0')) {
        pcVar1 = (tfield->name_)._M_dataplus._M_p;
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
               *(undefined8 *)CONCAT44(extraout_var,iVar2));
      }
      else {
        poVar3 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "";
        if (local) {
          pcVar6 = "local ";
        }
        lVar5 = 6;
        if (!local) {
          lVar5 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = iprot:",9);
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar2 == '\0') {
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar2 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(out,"readI32()",9);
          }
        }
        else {
          this_00 = (t_base_type *)
                    (ulong)*(uint *)&(tstruct->members_).
                                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
          lVar5 = 0xc;
          switch(this_00) {
          case (t_base_type *)0x0:
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                           &local_b0);
            __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            pcVar6 = "readString()";
            break;
          case (t_base_type *)0x2:
            lVar5 = 10;
            pcVar6 = "readBool()";
            break;
          case (t_base_type *)0x3:
            lVar5 = 10;
            pcVar6 = "readByte()";
            break;
          case (t_base_type *)0x4:
            lVar5 = 9;
            pcVar6 = "readI16()";
            break;
          case (t_base_type *)0x5:
            lVar5 = 9;
            pcVar6 = "readI32()";
            break;
          case (t_base_type *)0x6:
            lVar5 = 9;
            pcVar6 = "readI64()";
            break;
          case (t_base_type *)0x7:
            pcVar6 = "readDouble()";
            break;
          default:
            auVar9 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_50,this_00,auVar9._8_4_);
            std::operator+(auVar9._0_8_,"compiler error: no PHP name for base type ",&local_50);
            __cxa_throw(auVar9._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      goto LAB_002ac94f;
    }
    paVar8 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    generate_deserialize_container(this,out,(t_type *)tstruct,local,&local_90);
    _Var7._M_p = local_90._M_dataplus._M_p;
  }
  else {
    paVar8 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    generate_deserialize_struct(this,out,tstruct,local,&local_70);
    _Var7._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
LAB_002ac94f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 bool local,
                                                 string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name();

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, local, name);
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, local, name);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << (local ? "local " : "") << name << " = iprot:";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "readString()";
        break;
      case t_base_type::TYPE_BOOL:
        out << "readBool()";
        break;
      case t_base_type::TYPE_I8:
        out << "readByte()";
        break;
      case t_base_type::TYPE_I16:
        out << "readI16()";
        break;
      case t_base_type::TYPE_I32:
        out << "readI32()";
        break;
      case t_base_type::TYPE_I64:
        out << "readI64()";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "readDouble()";
        break;
      default:
        throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "readI32()";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}